

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O0

ze_result_t driver::zetMetricTracerDestroyExp(zet_metric_tracer_exp_handle_t hMetricTracer)

{
  zet_pfnMetricTracerDestroyExp_t pfnDestroyExp;
  ze_result_t result;
  zet_metric_tracer_exp_handle_t hMetricTracer_local;
  
  pfnDestroyExp._4_4_ = ZE_RESULT_SUCCESS;
  if (DAT_0011c7b8 != (code *)0x0) {
    pfnDestroyExp._4_4_ = (*DAT_0011c7b8)(hMetricTracer);
  }
  return pfnDestroyExp._4_4_;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricTracerDestroyExp(
        zet_metric_tracer_exp_handle_t hMetricTracer    ///< [in] handle of the metric tracer
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnDestroyExp = context.zetDdiTable.MetricTracerExp.pfnDestroyExp;
        if( nullptr != pfnDestroyExp )
        {
            result = pfnDestroyExp( hMetricTracer );
        }
        else
        {
            // generic implementation
        }

        return result;
    }